

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

char * md5_print(uchar *md5,char *out)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    out[lVar1 * 2] = "0123456789abcdef"[md5[lVar1] >> 4];
    out[lVar1 * 2 + 1] = "0123456789abcdef"[md5[lVar1] & 0xf];
  }
  out[0x20] = '\0';
  return out;
}

Assistant:

static char *md5_print(unsigned char *md5, char *out) {
    int i;
    for (i = 0; i < 16; i++) {
	out[i*2+0] = "0123456789abcdef"[md5[i]>>4];
	out[i*2+1] = "0123456789abcdef"[md5[i]&15];
    }
    out[32] = 0;

    return out;
}